

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void substrFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  i64 iVar4;
  byte *z;
  long lVar5;
  byte *pbVar6;
  byte bVar7;
  u8 uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  
  if ((argv[1]->type != '\x05') && ((argc != 3 || (argv[2]->type != '\x05')))) {
    uVar8 = (*argv)->type;
    iVar4 = sqlite3VdbeIntValue(argv[1]);
    iVar3 = (int)iVar4;
    if (uVar8 == '\x04') {
      iVar1 = sqlite3ValueBytes(*argv,'\x01');
      z = (byte *)sqlite3_value_blob(*argv);
      if (z != (byte *)0x0) {
LAB_001a12fc:
        if (argc == 3) {
          iVar4 = sqlite3VdbeIntValue(argv[2]);
          iVar2 = (int)iVar4;
          bVar13 = -1 < iVar2;
          lVar12 = -(long)iVar2;
          if (bVar13) {
            lVar12 = (long)iVar2;
          }
        }
        else {
          bVar13 = true;
          lVar12 = (long)((context->s).db)->aLimit[0];
        }
        if (iVar3 < 0) {
          lVar11 = (long)iVar3 + (long)iVar1;
          if (lVar11 < 0) {
            lVar12 = lVar12 + lVar11;
            lVar11 = 0;
            if (lVar12 < 1) {
              lVar12 = lVar11;
            }
          }
        }
        else if (iVar3 == 0) {
          lVar11 = 0;
          lVar12 = lVar12 - (ulong)(0 < lVar12);
        }
        else {
          lVar11 = (long)iVar3 + -1;
        }
        lVar9 = lVar11 - lVar12;
        lVar5 = 0;
        if (0 < lVar9) {
          lVar5 = lVar9;
        }
        lVar10 = lVar12;
        if (lVar9 < 0) {
          lVar10 = lVar11;
        }
        if (bVar13) {
          lVar10 = lVar12;
          lVar5 = lVar11;
        }
        if (uVar8 == '\x04') {
          lVar12 = iVar1 - lVar5;
          if (lVar12 < 1) {
            lVar12 = 0;
          }
          z = z + lVar5;
          if ((long)iVar1 < lVar10 + lVar5) {
            lVar10 = lVar12;
          }
          iVar3 = (int)lVar10;
          uVar8 = '\0';
        }
        else {
          bVar7 = *z;
          if (bVar7 != 0) {
            for (; lVar5 != 0; lVar5 = lVar5 + -1) {
              if (bVar7 < 0xc0) {
                bVar7 = z[1];
              }
              else {
                bVar7 = z[1];
              }
              z = z + 1;
              if (bVar7 == 0) break;
            }
          }
          pbVar6 = z;
          if (bVar7 != 0) {
            for (; lVar10 != 0; lVar10 = lVar10 + -1) {
              if (bVar7 < 0xc0) {
                bVar7 = pbVar6[1];
              }
              else {
                bVar7 = pbVar6[1];
              }
              pbVar6 = pbVar6 + 1;
              if (bVar7 == 0) break;
            }
          }
          iVar3 = (int)pbVar6 - (int)z;
          uVar8 = '\x01';
        }
        setResultStrOrError(context,(char *)z,iVar3,uVar8,(_func_void_void_ptr *)0xffffffffffffffff)
        ;
        return;
      }
    }
    else {
      z = (byte *)sqlite3ValueText(*argv,'\x01');
      if (z != (byte *)0x0) {
        iVar1 = 0;
        if ((iVar3 < 0) && (bVar7 = *z, bVar7 != 0)) {
          iVar1 = 0;
          pbVar6 = z;
          do {
            if (bVar7 < 0xc0) {
              bVar7 = pbVar6[1];
            }
            else {
              bVar7 = pbVar6[1];
            }
            pbVar6 = pbVar6 + 1;
            iVar1 = iVar1 + 1;
          } while (bVar7 != 0);
        }
        goto LAB_001a12fc;
      }
    }
  }
  return;
}

Assistant:

static void substrFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *z;
  const unsigned char *z2;
  int len;
  int p0type;
  i64 p1, p2;
  int negP2 = 0;

  assert( argc==3 || argc==2 );
  if( sqlite3_value_type(argv[1])==SQLITE_NULL
   || (argc==3 && sqlite3_value_type(argv[2])==SQLITE_NULL)
  ){
    return;
  }
  p0type = sqlite3_value_type(argv[0]);
  p1 = sqlite3_value_int(argv[1]);
  if( p0type==SQLITE_BLOB ){
    len = sqlite3_value_bytes(argv[0]);
    z = sqlite3_value_blob(argv[0]);
    if( z==0 ) return;
    assert( len==sqlite3_value_bytes(argv[0]) );
  }else{
    z = sqlite3_value_text(argv[0]);
    if( z==0 ) return;
    len = 0;
    if( p1<0 ){
      for(z2=z; *z2; len++){
        SQLITE_SKIP_UTF8(z2);
      }
    }
  }
  if( argc==3 ){
    p2 = sqlite3_value_int(argv[2]);
    if( p2<0 ){
      p2 = -p2;
      negP2 = 1;
    }
  }else{
    p2 = sqlite3_context_db_handle(context)->aLimit[SQLITE_LIMIT_LENGTH];
  }
  if( p1<0 ){
    p1 += len;
    if( p1<0 ){
      p2 += p1;
      if( p2<0 ) p2 = 0;
      p1 = 0;
    }
  }else if( p1>0 ){
    p1--;
  }else if( p2>0 ){
    p2--;
  }
  if( negP2 ){
    p1 -= p2;
    if( p1<0 ){
      p2 += p1;
      p1 = 0;
    }
  }
  assert( p1>=0 && p2>=0 );
  if( p0type!=SQLITE_BLOB ){
    while( *z && p1 ){
      SQLITE_SKIP_UTF8(z);
      p1--;
    }
    for(z2=z; *z2 && p2; p2--){
      SQLITE_SKIP_UTF8(z2);
    }
    sqlite3_result_text(context, (char*)z, (int)(z2-z), SQLITE_TRANSIENT);
  }else{
    if( p1+p2>len ){
      p2 = len-p1;
      if( p2<0 ) p2 = 0;
    }
    sqlite3_result_blob(context, (char*)&z[p1], (int)p2, SQLITE_TRANSIENT);
  }
}